

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-shutdown-after-write.c
# Opt level: O1

int run_test_tcp_shutdown_after_write(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  undefined8 uVar2;
  int *piVar3;
  undefined8 *extraout_RDX;
  int iVar4;
  uv_write_t *puVar5;
  uv_shutdown_t *puVar6;
  uv_tcp_t *puVar7;
  sockaddr_in addr;
  undefined1 auStack_28 [8];
  undefined8 uStack_20;
  undefined1 auStack_18 [16];
  
  uStack_20 = (code *)0x1739cd;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,auStack_18);
  if (iVar1 == 0) {
    uStack_20 = (code *)0x1739da;
    uVar2 = uv_default_loop();
    uStack_20 = (code *)0x1739ec;
    iVar1 = uv_timer_init(uVar2,&timer);
    if (iVar1 != 0) goto LAB_00173ad2;
    uStack_20 = (code *)0x173a0e;
    iVar1 = uv_timer_start(&timer,timer_cb,0x7d,0);
    if (iVar1 != 0) goto LAB_00173ad7;
    uStack_20 = (code *)0x173a25;
    iVar1 = uv_tcp_init(uVar2,&conn);
    if (iVar1 != 0) goto LAB_00173adc;
    uStack_20 = (code *)0x173a4a;
    iVar1 = uv_tcp_connect(&connect_req,&conn,auStack_18,connect_cb);
    if (iVar1 != 0) goto LAB_00173ae1;
    uStack_20 = (code *)0x173a5c;
    iVar1 = uv_run(uVar2,0);
    if (iVar1 != 0) goto LAB_00173ae6;
    if (connect_cb_called != 1) goto LAB_00173aeb;
    if (write_cb_called != 1) goto LAB_00173af0;
    if (shutdown_cb_called != 1) goto LAB_00173af5;
    if (conn_close_cb_called != 1) goto LAB_00173afa;
    if (timer_close_cb_called == 1) {
      uStack_20 = (code *)0x173a96;
      uVar2 = uv_default_loop();
      uStack_20 = (code *)0x173aaa;
      uv_walk(uVar2,close_walk_cb,0);
      uStack_20 = (code *)0x173ab4;
      uv_run(uVar2,0);
      uStack_20 = (code *)0x173ab9;
      uVar2 = uv_default_loop();
      uStack_20 = (code *)0x173ac1;
      iVar1 = uv_loop_close(uVar2);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_00173b04;
    }
  }
  else {
    uStack_20 = (code *)0x173ad2;
    run_test_tcp_shutdown_after_write_cold_1();
LAB_00173ad2:
    uStack_20 = (code *)0x173ad7;
    run_test_tcp_shutdown_after_write_cold_2();
LAB_00173ad7:
    uStack_20 = (code *)0x173adc;
    run_test_tcp_shutdown_after_write_cold_3();
LAB_00173adc:
    uStack_20 = (code *)0x173ae1;
    run_test_tcp_shutdown_after_write_cold_4();
LAB_00173ae1:
    uStack_20 = (code *)0x173ae6;
    run_test_tcp_shutdown_after_write_cold_5();
LAB_00173ae6:
    uStack_20 = (code *)0x173aeb;
    run_test_tcp_shutdown_after_write_cold_6();
LAB_00173aeb:
    uStack_20 = (code *)0x173af0;
    run_test_tcp_shutdown_after_write_cold_7();
LAB_00173af0:
    uStack_20 = (code *)0x173af5;
    run_test_tcp_shutdown_after_write_cold_8();
LAB_00173af5:
    uStack_20 = (code *)0x173afa;
    run_test_tcp_shutdown_after_write_cold_9();
LAB_00173afa:
    uStack_20 = (code *)0x173aff;
    run_test_tcp_shutdown_after_write_cold_10();
  }
  uStack_20 = (code *)0x173b04;
  run_test_tcp_shutdown_after_write_cold_11();
LAB_00173b04:
  uStack_20 = timer_cb;
  run_test_tcp_shutdown_after_write_cold_12();
  uv_close();
  _auStack_28 = uv_buf_init("TEST",4);
  puVar5 = &write_req;
  iVar4 = 0x32eff8;
  iVar1 = uv_write(&write_req,&conn,auStack_28,1,write_cb);
  if (iVar1 == 0) {
    puVar6 = &shutdown_req;
    iVar4 = 0x32eff8;
    iVar1 = uv_shutdown(&shutdown_req,&conn,shutdown_cb);
    puVar7 = (uv_tcp_t *)puVar6;
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    timer_cb_cold_1();
    puVar7 = (uv_tcp_t *)puVar5;
  }
  timer_cb_cold_2();
  if (iVar4 == 0) {
    connect_cb_called = connect_cb_called + 1;
    puVar7 = &conn;
    iVar4 = 0x173c23;
    iVar1 = uv_read_start(&conn,alloc_cb,read_cb);
    if (iVar1 == 0) {
      return extraout_EAX;
    }
  }
  else {
    connect_cb_cold_1();
  }
  connect_cb_cold_2();
  if (puVar7 == &conn) {
    piVar3 = &conn_close_cb_called;
  }
  else {
    if (puVar7 != (uv_tcp_t *)&timer) {
      close_cb_cold_1();
      if (iVar4 == 0) {
        write_cb_called = write_cb_called + 1;
        return extraout_EAX_00;
      }
      write_cb_cold_1();
      if (iVar4 == 0) {
        shutdown_cb_called = shutdown_cb_called + 1;
        iVar1 = uv_close(&conn,close_cb);
        return iVar1;
      }
      shutdown_cb_cold_1();
      *extraout_RDX = alloc_cb::slab;
      extraout_RDX[1] = 0x40;
      return 0x32f280;
    }
    piVar3 = &timer_close_cb_called;
  }
  *piVar3 = *piVar3 + 1;
  return (int)piVar3;
}

Assistant:

TEST_IMPL(tcp_shutdown_after_write) {
  struct sockaddr_in addr;
  uv_loop_t* loop;
  int r;

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));
  loop = uv_default_loop();

  r = uv_timer_init(loop, &timer);
  ASSERT(r == 0);

  r = uv_timer_start(&timer, timer_cb, 125, 0);
  ASSERT(r == 0);

  r = uv_tcp_init(loop, &conn);
  ASSERT(r == 0);

  r = uv_tcp_connect(&connect_req,
                     &conn,
                     (const struct sockaddr*) &addr,
                     connect_cb);
  ASSERT(r == 0);

  r = uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(connect_cb_called == 1);
  ASSERT(write_cb_called == 1);
  ASSERT(shutdown_cb_called == 1);
  ASSERT(conn_close_cb_called == 1);
  ASSERT(timer_close_cb_called == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}